

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStreamPrivate::consumeLastToken(QTextStreamPrivate *this)

{
  if (this->lastTokenSize != 0) {
    consume(this,this->lastTokenSize);
  }
  this->lastTokenSize = 0;
  return;
}

Assistant:

inline void QTextStreamPrivate::consumeLastToken()
{
    if (lastTokenSize)
        consume(lastTokenSize);
    lastTokenSize = 0;
}